

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_cbor_binary(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *this,binary_t *result)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar1;
  byte bVar2;
  char_int_type cVar3;
  const_iterator __position;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_RSI;
  long in_RDI;
  string last_token;
  binary_t chunk;
  uint64_t len_3;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined8 in_stack_fffffffffffffe68;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe70;
  binary_t *in_stack_fffffffffffffe78;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe80;
  input_format_t iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe88;
  char (*args) [96];
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffea8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffec8;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  undefined1 local_d0 [40];
  string local_a8 [24];
  void *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff88;
  int id_;
  uchar local_50 [40];
  undefined8 local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  byte local_1;
  
  bVar1 = unexpect_eof(in_stack_ffffffffffffff88,(input_format_t)(in_stack_ffffffffffffff80 >> 0x20)
                       ,(char *)in_stack_ffffffffffffff78);
  id_ = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __position._M_current = (uchar *)(ulong)(*(int *)(in_RDI + 0x10) - 0x40);
    iVar4 = (input_format_t)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    switch(__position._M_current) {
    case (uchar *)0x0:
    case (uchar *)0x1:
    case (uchar *)0x2:
    case (uchar *)0x3:
    case (uchar *)0x4:
    case (uchar *)0x5:
    case (uchar *)0x6:
    case (uchar *)0x7:
    case (uchar *)0x8:
    case (uchar *)0x9:
    case (uchar *)0xa:
    case (uchar *)0xb:
    case (uchar *)0xc:
    case (uchar *)0xd:
    case (uchar *)0xe:
    case (uchar *)0xf:
    case (uchar *)0x10:
    case (uchar *)0x11:
    case (uchar *)0x12:
    case (uchar *)0x13:
    case (uchar *)0x14:
    case (uchar *)0x15:
    case (uchar *)0x16:
    case (uchar *)0x17:
      local_1 = get_binary<unsigned_int>
                          (in_stack_fffffffffffffe80,
                           (input_format_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                           (uint)in_stack_fffffffffffffe78,(binary_t *)in_stack_fffffffffffffe70);
      break;
    case (uchar *)0x18:
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_char,false>
                        (in_stack_fffffffffffffe88,iVar4,(uchar *)in_stack_fffffffffffffe78);
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_char>
                            (in_stack_fffffffffffffe70,
                             (input_format_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                             (uchar)((ulong)in_stack_fffffffffffffe68 >> 0x18),
                             (binary_t *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      }
      break;
    case (uchar *)0x19:
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_short,false>
                        (in_stack_fffffffffffffe88,iVar4,(unsigned_short *)in_stack_fffffffffffffe78
                        );
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_short>
                            (in_stack_fffffffffffffe70,
                             (input_format_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                             (unsigned_short)((ulong)in_stack_fffffffffffffe68 >> 0x10),
                             (binary_t *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      }
      break;
    case (uchar *)0x1a:
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_int,false>
                        (in_stack_fffffffffffffe88,iVar4,(uint *)in_stack_fffffffffffffe78);
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_int>
                            (in_stack_fffffffffffffe80,
                             (input_format_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                             (uint)in_stack_fffffffffffffe78,(binary_t *)in_stack_fffffffffffffe70);
      }
      break;
    case (uchar *)0x1b:
      local_28 = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_long,false>
                        (in_stack_fffffffffffffe88,iVar4,(unsigned_long *)in_stack_fffffffffffffe78)
      ;
      local_1 = 0;
      if (bVar1) {
        local_1 = get_binary<unsigned_long>
                            (in_stack_fffffffffffffe90,
                             (input_format_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                             (unsigned_long)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      }
      break;
    default:
      get_token_string(in_stack_fffffffffffffea8);
      args = *(char (**) [96])(in_RDI + 0x18);
      args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (in_RDI + 0x28);
      concat<std::__cxx11::string,char_const(&)[96],std::__cxx11::string&>(args,args_1);
      iVar4 = (input_format_t)((ulong)in_RDI >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffea0._M_current,in_stack_fffffffffffffe98,
                 (allocator<char> *)in_stack_fffffffffffffe90);
      exception_message(in_stack_fffffffffffffec8,iVar4,(string *)__position._M_current,
                        (string *)
                        CONCAT17(in_stack_fffffffffffffeb7,
                                 CONCAT16(in_stack_fffffffffffffeb6,
                                          CONCAT15(in_stack_fffffffffffffeb5,
                                                   CONCAT14(in_stack_fffffffffffffeb4,
                                                            in_stack_fffffffffffffeb0)))));
      parse_error::create<std::nullptr_t,_0>
                (id_,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      bVar2 = (**(code **)(*(long *)args_1 + 0x60))(args_1,args,local_a8,local_d0);
      local_1 = bVar2 & 1;
      parse_error::~parse_error((parse_error *)0x26e609);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_a8);
      break;
    case (uchar *)0x1f:
      do {
        cVar3 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                     *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        if (cVar3 == 0xff) {
          local_1 = 1;
          break;
        }
        __last._M_current = local_50;
        byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        byte_container_with_subtype
                  ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        bVar1 = get_cbor_binary(in_RSI,(binary_t *)
                                       CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT24(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0))));
        in_stack_fffffffffffffeb0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb0);
        if (bVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe58)
          ;
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffe58);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (in_stack_fffffffffffffe58);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe58)
          ;
          __first._M_current._4_1_ = in_stack_fffffffffffffeb4;
          __first._M_current._0_4_ = in_stack_fffffffffffffeb0;
          __first._M_current._5_1_ = in_stack_fffffffffffffeb5;
          __first._M_current._6_1_ = in_stack_fffffffffffffeb6;
          __first._M_current._7_1_ = in_stack_fffffffffffffeb7;
          in_stack_fffffffffffffea0 =
               std::vector<unsigned_char,std::allocator<unsigned_char>>::
               insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                         (in_stack_fffffffffffffea0._M_current,__position,__first,__last);
        }
        else {
          local_1 = 0;
        }
        byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        ~byte_container_with_subtype
                  ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x26e4e1);
      } while (bVar1);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool get_cbor_binary(binary_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "binary")))
        {
            return false;
        }

        switch (current)
        {
            // Binary data (0x00..0x17 bytes follow)
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            {
                return get_binary(input_format_t::cbor, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0x58: // Binary data (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x59: // Binary data (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5A: // Binary data (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5B: // Binary data (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5F: // Binary data (indefinite length)
            {
                while (get() != 0xFF)
                {
                    binary_t chunk;
                    if (!get_cbor_binary(chunk))
                    {
                        return false;
                    }
                    result.insert(result.end(), chunk.begin(), chunk.end());
                }
                return true;
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read,
                                        exception_message(input_format_t::cbor, concat("expected length specification (0x40-0x5B) or indefinite binary array type (0x5F); last byte: 0x", last_token), "binary"), nullptr));
            }
        }
    }